

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O3

value_ptr __thiscall pstore::dump::make_value(dump *this,trailer *trailer,bool no_times)

{
  atomic<unsigned_int> *paVar1;
  uint uVar2;
  _func_int **pp_Var3;
  value_type vVar4;
  char *pcVar5;
  dump *pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  __int_type_conflict1 _Var9;
  long lVar10;
  value_ptr vVar11;
  initializer_list<pstore::dump::object::member> __l;
  allocator_type local_389;
  value_ptr local_388;
  value_ptr local_378;
  value_ptr local_368;
  value_ptr local_358;
  value_ptr local_348;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  dump *local_258;
  value_ptr local_250;
  value_ptr local_240;
  value_ptr local_230;
  string local_220;
  string local_200;
  trailer *local_1e0;
  array<unsigned_char,_8UL> *local_1d8;
  uint32_t *local_1d0;
  index_records_array *local_1c8;
  atomic<unsigned_int> *local_1c0;
  trailer *local_1b8;
  member local_1b0;
  member local_180;
  member local_150;
  member local_120;
  member local_f0;
  member local_c0;
  member local_90;
  member local_60;
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_258 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"signature1","");
  paVar1 = &(trailer->a).generation;
  local_1c0 = paVar1;
  local_1b8 = trailer;
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_230,(uchar **)&local_1b8,(uchar **)&local_1c0,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_1b0,&local_278,&local_230);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"generation","");
  uVar2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee168;
  local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = number_base::default_base_;
  local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f2740;
  local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._vptr__Sp_counted_base = (_func_int **)(ulong)uVar2;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_180,&local_298,&local_348);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"size","");
  pp_Var3 = (_func_int **)(trailer->a).size.super___atomic_base<unsigned_long>._M_i;
  local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee168;
  local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = number_base::default_base_;
  local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f2740;
  local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._vptr__Sp_counted_base = pp_Var3;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_150,&local_2b8,&local_358);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"time","");
  _Var9 = (trailer->a).time.super___atomic_base<unsigned_long>._M_i;
  local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  if (no_times) {
    _Var9 = 0;
  }
  (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f2288;
  local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f29e0;
  local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = (int)_Var9;
  local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_weak_count = (int)(_Var9 >> 0x20);
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_120,&local_2d8,&local_368);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"prev_generation","");
  vVar4 = (trailer->a).prev_generation.a_.a_;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001edcf8;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__address_001f21a8;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = (int)vVar4;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_weak_count = (int)(vVar4 >> 0x20);
  *(undefined1 *)
   &local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [2]._vptr__Sp_counted_base = address::default_expanded_;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._M_use_count = 0;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._M_weak_count = 0;
  local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]
  ._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_f0,&local_2f8,&local_378);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"indices","");
  local_1c8 = &(trailer->a).index_records;
  local_1d0 = &(trailer->a).unused2;
  make_value<pstore::typed_address<pstore::index::header_block>const*,pstore::typed_address<pstore::index::header_block>,std::shared_ptr<pstore::dump::value>(*)(pstore::typed_address<pstore::index::header_block>const&)>
            ((dump *)&local_240,(typed_address<pstore::index::header_block> **)&local_1c8,
             (typed_address<pstore::index::header_block> **)&local_1d0,
             details::default_make_value<pstore::typed_address<pstore::index::header_block>const&>);
  object::member::member(&local_c0,&local_200,&local_240);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"crc","");
  uVar2 = trailer->crc;
  local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee168;
  local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = number_base::default_base_;
  local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_001f2740;
  local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._vptr__Sp_counted_base = (_func_int **)(ulong)uVar2;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_90,&local_318,&local_388);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"signature2","");
  local_1d8 = &trailer->signature2;
  local_1e0 = trailer + 1;
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_250,(uchar **)&local_1d8,(uchar **)&local_1e0,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_60,&local_220,&local_250);
  pdVar6 = local_258;
  __l._M_len = 8;
  __l._M_array = &local_1b0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_338,__l,&local_389);
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee118;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR__object_001f2ba0;
  *(pointer *)&p_Var7[1]._M_use_count =
       local_338.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var7[2]._vptr__Sp_counted_base =
       (_func_int **)
       local_338.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var7[2]._M_use_count =
       local_338.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_338.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&p_Var7[3]._vptr__Sp_counted_base = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)pdVar6 = p_Var7 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pdVar6 + 8) = p_Var7;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var7->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_338);
  lVar10 = 0;
  _Var8._M_pi = extraout_RDX;
  do {
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&local_60.val.
                      super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + lVar10);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      _Var8._M_pi = extraout_RDX_00;
    }
    pcVar5 = *(char **)((long)&local_60.property._M_dataplus._M_p + lVar10);
    if (local_60.property.field_2._M_local_buf + lVar10 != pcVar5) {
      operator_delete(pcVar5,*(long *)((long)&local_60.property.field_2 + lVar10) + 1);
      _Var8._M_pi = extraout_RDX_01;
    }
    lVar10 = lVar10 + -0x30;
  } while (lVar10 != -0x180);
  if (local_250.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_250.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_03;
  }
  if (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_05;
  }
  if (local_240.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_240.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_07;
  }
  if (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_08;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_09;
  }
  if (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_11;
  }
  if (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_13;
  }
  if (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_15;
  }
  if (local_230.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_230.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_16;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_17;
  }
  vVar11.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  vVar11.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdVar6;
  return (value_ptr)vVar11.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (trailer const & trailer, bool const no_times) {
            return make_value (object::container{
                {"signature1",
                 make_value (std::begin (trailer.a.signature1), std::end (trailer.a.signature1))},
                {"generation", make_value (trailer.a.generation.load ())},
                {"size", make_value (trailer.a.size.load ())},
                {"time", make_time (trailer.a.time, no_times)},
                {"prev_generation", make_value (trailer.a.prev_generation)},
                {"indices", make_value (std::begin (trailer.a.index_records),
                                        std::end (trailer.a.index_records))},
                {"crc", make_value (trailer.crc)},
                {"signature2",
                 make_value (std::begin (trailer.signature2), std::end (trailer.signature2))},
            });
        }